

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool VerifyWitnessProgram
               (CScriptWitness *witness,int witversion,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *program,uint flags,
               BaseSignatureChecker *checker,ScriptError *serror,bool is_p2sh)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first_00;
  span<const_unsigned_char,_18446744073709551615UL> b;
  Span<const_unsigned_char> script_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  size_type sVar4;
  size_t sVar5;
  uchar *__s1;
  uchar *__s2;
  Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *stack_span;
  const_reference pvVar6;
  byte *pbVar7;
  const_iterator serror_00;
  uint in_ECX;
  int in_ESI;
  long *in_R8;
  ScriptExecutionData *in_R9;
  long in_FS_OFFSET;
  byte in_stack_00000008;
  valtype *script;
  valtype *control;
  valtype *annex;
  valtype *script_bytes;
  Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> stack;
  uint256 hash_exec_script;
  ScriptExecutionData execdata;
  CScript exec_script;
  ScriptExecutionData *in_stack_fffffffffffffc28;
  CScript *in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc3c;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffc40;
  undefined5 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4d;
  undefined1 in_stack_fffffffffffffc4e;
  undefined1 in_stack_fffffffffffffc4f;
  uchar *in_stack_fffffffffffffc50;
  CSHA256 *in_stack_fffffffffffffc58;
  opcodetype opcode;
  undefined7 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc67;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffc68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *control_00;
  ScriptExecutionData *in_stack_fffffffffffffc90;
  HashWriter *in_stack_fffffffffffffc98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffca0;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *in_stack_fffffffffffffcb0
  ;
  ScriptError *in_stack_fffffffffffffd10;
  bool local_269;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  ScriptExecutionData local_a8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CScript::CScript((CScript *)in_stack_fffffffffffffc28);
  Span<std::vector<unsigned_char,std::allocator<unsigned_char>>const>::
  Span<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
             (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  ScriptExecutionData::ScriptExecutionData(in_stack_fffffffffffffc28);
  if (in_ESI == 0) {
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffc28);
    if (sVar4 == 0x20) {
      sVar5 = Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::size
                        ((Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                         in_stack_fffffffffffffc28);
      if (sVar5 == 0) {
        local_269 = anon_unknown.dwarf_15824b8::set_error
                              ((ScriptError *)in_stack_fffffffffffffc28,SCRIPT_ERR_OK);
      }
      else {
        SpanPopBack<std::vector<unsigned_char,std::allocator<unsigned_char>>const>
                  ((Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                   CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffc30);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffc30);
        first._M_current._5_1_ = in_stack_fffffffffffffc4d;
        first._M_current._0_5_ = in_stack_fffffffffffffc48;
        first._M_current._6_1_ = in_stack_fffffffffffffc4e;
        first._M_current._7_1_ = in_stack_fffffffffffffc4f;
        CScript::
        CScript<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ((CScript *)in_stack_fffffffffffffc28,first,in_stack_fffffffffffffc40);
        CScript::operator=((CScript *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                           in_stack_fffffffffffffc30);
        CScript::~CScript((CScript *)in_stack_fffffffffffffc28);
        uint256::uint256((uint256 *)in_stack_fffffffffffffc28);
        CSHA256::CSHA256((CSHA256 *)in_stack_fffffffffffffc28);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::data
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffc28);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                   CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        CSHA256::Write(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                       CONCAT17(in_stack_fffffffffffffc4f,
                                CONCAT16(in_stack_fffffffffffffc4e,
                                         CONCAT15(in_stack_fffffffffffffc4d,
                                                  in_stack_fffffffffffffc48))));
        base_blob<256U>::begin((base_blob<256U> *)in_stack_fffffffffffffc28);
        CSHA256::Finalize((CSHA256 *)in_stack_fffffffffffffc40._M_current,
                          (uchar *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        __s1 = base_blob<256U>::begin((base_blob<256U> *)in_stack_fffffffffffffc28);
        __s2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          in_stack_fffffffffffffc28);
        iVar3 = memcmp(__s1,__s2,0x20);
        if (iVar3 == 0) {
          local_269 = ExecuteWitnessScript
                                (in_stack_fffffffffffffcb0,
                                 (CScript *)
                                 CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                                 (uint)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                                 (SigVersion)in_stack_fffffffffffffca0,
                                 (BaseSignatureChecker *)in_stack_fffffffffffffc98,
                                 in_stack_fffffffffffffc90,in_stack_fffffffffffffd10);
          in_stack_fffffffffffffc28 = in_R9;
        }
        else {
          local_269 = anon_unknown.dwarf_15824b8::set_error
                                ((ScriptError *)in_stack_fffffffffffffc28,SCRIPT_ERR_OK);
        }
      }
    }
    else {
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffc28);
      opcode = (opcodetype)((ulong)in_stack_fffffffffffffc58 >> 0x20);
      if (sVar4 == 0x14) {
        sVar5 = Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::size
                          ((Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)in_stack_fffffffffffffc28);
        if (sVar5 == 2) {
          CScript::operator<<((CScript *)
                              CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),opcode);
          CScript::operator<<((CScript *)
                              CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),opcode);
          std::span<const_unsigned_char,_18446744073709551615UL>::
          span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                    ((span<const_unsigned_char,_18446744073709551615UL> *)
                     CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffc30);
          b._M_ptr._7_1_ = in_stack_fffffffffffffc67;
          b._M_ptr._0_7_ = in_stack_fffffffffffffc60;
          b._M_extent._M_extent_value = in_stack_fffffffffffffc68._M_extent_value;
          CScript::operator<<((CScript *)
                              CONCAT17(in_stack_fffffffffffffc4f,
                                       CONCAT16(in_stack_fffffffffffffc4e,
                                                CONCAT15(in_stack_fffffffffffffc4d,
                                                         in_stack_fffffffffffffc48))),b);
          stack_span = (Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                       CScript::operator<<((CScript *)
                                           CONCAT17(in_stack_fffffffffffffc67,
                                                    in_stack_fffffffffffffc60),opcode);
          CScript::operator<<((CScript *)
                              CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),opcode);
          local_269 = ExecuteWitnessScript
                                (stack_span,
                                 (CScript *)
                                 CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                                 (uint)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                                 (SigVersion)in_stack_fffffffffffffca0,
                                 (BaseSignatureChecker *)in_stack_fffffffffffffc98,
                                 in_stack_fffffffffffffc90,in_stack_fffffffffffffd10);
          in_stack_fffffffffffffc28 = in_R9;
        }
        else {
          local_269 = anon_unknown.dwarf_15824b8::set_error
                                ((ScriptError *)in_stack_fffffffffffffc28,SCRIPT_ERR_OK);
        }
      }
      else {
        local_269 = anon_unknown.dwarf_15824b8::set_error
                              ((ScriptError *)in_stack_fffffffffffffc28,SCRIPT_ERR_OK);
      }
    }
    goto LAB_00e8eeac;
  }
  if (((in_ESI != 1) ||
      (sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          in_stack_fffffffffffffc28), sVar4 != 0x20)) ||
     ((in_stack_00000008 & 1) != 0)) {
    if (((in_stack_00000008 & 1) == 0) &&
       (bVar1 = CScript::IsPayToAnchor
                          (in_stack_fffffffffffffc3c,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffc30), bVar1)) {
      local_269 = true;
    }
    else if ((in_ECX & 0x1000) == 0) {
      local_269 = true;
    }
    else {
      local_269 = anon_unknown.dwarf_15824b8::set_error
                            ((ScriptError *)in_stack_fffffffffffffc28,SCRIPT_ERR_OK);
    }
    goto LAB_00e8eeac;
  }
  if ((in_ECX & 0x20000) == 0) {
    local_269 = anon_unknown.dwarf_15824b8::set_success((ScriptError *)in_stack_fffffffffffffc28);
    goto LAB_00e8eeac;
  }
  sVar5 = Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::size
                    ((Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                     in_stack_fffffffffffffc28);
  if (sVar5 == 0) {
    local_269 = anon_unknown.dwarf_15824b8::set_error
                          ((ScriptError *)in_stack_fffffffffffffc28,SCRIPT_ERR_OK);
    goto LAB_00e8eeac;
  }
  sVar5 = Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::size
                    ((Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                     in_stack_fffffffffffffc28);
  if (sVar5 < 2) {
LAB_00e8e9fd:
    local_a8.m_annex_present = false;
  }
  else {
    Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::back
              ((Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffffc28);
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    if (bVar1) goto LAB_00e8e9fd;
    Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::back
              ((Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffffc28);
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                        (size_type)in_stack_fffffffffffffc30);
    if (*pvVar6 != 'P') goto LAB_00e8e9fd;
    in_stack_fffffffffffffca0 =
         SpanPopBack<std::vector<unsigned_char,std::allocator<unsigned_char>>const>
                   ((Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                    CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    HashWriter::HashWriter((HashWriter *)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc98 =
         HashWriter::operator<<
                   ((HashWriter *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffffc30);
    HashWriter::GetSHA256
              ((HashWriter *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    local_a8.m_annex_present = true;
  }
  local_a8.m_annex_init = true;
  sVar5 = Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::size
                    ((Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                     in_stack_fffffffffffffc28);
  if (sVar5 == 1) {
    Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::front
              ((Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffffc28);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)
               CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc30,
               in_stack_fffffffffffffc28);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)
               CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc30,
               in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc28 = &local_a8;
    bVar2 = (**(code **)(*in_R8 + 8))
                      (in_R8,local_248,local_240,local_258,local_250,2,in_stack_fffffffffffffc28,
                       in_R9);
    if ((bVar2 & 1) == 0) {
      local_269 = false;
    }
    else {
      local_269 = anon_unknown.dwarf_15824b8::set_success((ScriptError *)in_stack_fffffffffffffc28);
    }
  }
  else {
    SpanPopBack<std::vector<unsigned_char,std::allocator<unsigned_char>>const>
              ((Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    SpanPopBack<std::vector<unsigned_char,std::allocator<unsigned_char>>const>
              ((Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffc28);
    if (((sVar4 < 0x21) ||
        (sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            in_stack_fffffffffffffc28), 0x1021 < sVar4)) ||
       (sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffc28), (sVar4 - 0x21 & 0x1f) != 0)) {
      local_269 = anon_unknown.dwarf_15824b8::set_error
                            ((ScriptError *)in_stack_fffffffffffffc28,SCRIPT_ERR_OK);
    }
    else {
      control_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                 (size_type)in_stack_fffffffffffffc30);
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc30,
                 in_stack_fffffffffffffc28);
      script_00.m_data._7_1_ = in_stack_fffffffffffffc67;
      script_00.m_data._0_7_ = in_stack_fffffffffffffc60;
      script_00.m_size = (size_t)control_00;
      ComputeTapleafHash((uint8_t)((ulong)in_stack_fffffffffffffc58 >> 0x38),script_00);
      bVar1 = VerifyTaprootCommitment
                        (control_00,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                         (uint256 *)in_stack_fffffffffffffc58);
      if (bVar1) {
        local_a8.m_tapleaf_hash_init = true;
        pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                            (size_type)in_stack_fffffffffffffc30);
        if ((*pbVar7 & 0xfe) == 0xc0) {
          serror_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffffc30);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffc30);
          first_00._M_current._5_1_ = in_stack_fffffffffffffc4d;
          first_00._M_current._0_5_ = in_stack_fffffffffffffc48;
          first_00._M_current._6_1_ = in_stack_fffffffffffffc4e;
          first_00._M_current._7_1_ = in_stack_fffffffffffffc4f;
          CScript::
          CScript<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ((CScript *)in_stack_fffffffffffffc28,first_00,in_stack_fffffffffffffc40);
          CScript::operator=((CScript *)
                             CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                             in_stack_fffffffffffffc30);
          CScript::~CScript((CScript *)in_stack_fffffffffffffc28);
          sVar5 = GetSerializeSize<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                            ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)in_stack_fffffffffffffc30);
          local_a8.m_validation_weight_left = sVar5 + 0x32;
          local_a8.m_validation_weight_left_init = true;
          local_269 = ExecuteWitnessScript
                                (in_stack_fffffffffffffcb0,
                                 (CScript *)
                                 CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                                 (uint)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                                 (SigVersion)in_stack_fffffffffffffca0,
                                 (BaseSignatureChecker *)in_stack_fffffffffffffc98,
                                 in_stack_fffffffffffffc90,(ScriptError *)serror_00._M_current);
          in_stack_fffffffffffffc28 = in_R9;
        }
        else if ((in_ECX & 0x40000) == 0) {
          local_269 = anon_unknown.dwarf_15824b8::set_success
                                ((ScriptError *)in_stack_fffffffffffffc28);
        }
        else {
          local_269 = anon_unknown.dwarf_15824b8::set_error
                                ((ScriptError *)in_stack_fffffffffffffc28,SCRIPT_ERR_OK);
        }
      }
      else {
        local_269 = anon_unknown.dwarf_15824b8::set_error
                              ((ScriptError *)in_stack_fffffffffffffc28,SCRIPT_ERR_OK);
      }
    }
  }
LAB_00e8eeac:
  CScript::~CScript((CScript *)in_stack_fffffffffffffc28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_269;
}

Assistant:

static bool VerifyWitnessProgram(const CScriptWitness& witness, int witversion, const std::vector<unsigned char>& program, unsigned int flags, const BaseSignatureChecker& checker, ScriptError* serror, bool is_p2sh)
{
    CScript exec_script; //!< Actually executed script (last stack item in P2WSH; implied P2PKH script in P2WPKH; leaf script in P2TR)
    Span stack{witness.stack};
    ScriptExecutionData execdata;

    if (witversion == 0) {
        if (program.size() == WITNESS_V0_SCRIPTHASH_SIZE) {
            // BIP141 P2WSH: 32-byte witness v0 program (which encodes SHA256(script))
            if (stack.size() == 0) {
                return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_WITNESS_EMPTY);
            }
            const valtype& script_bytes = SpanPopBack(stack);
            exec_script = CScript(script_bytes.begin(), script_bytes.end());
            uint256 hash_exec_script;
            CSHA256().Write(exec_script.data(), exec_script.size()).Finalize(hash_exec_script.begin());
            if (memcmp(hash_exec_script.begin(), program.data(), 32)) {
                return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH);
            }
            return ExecuteWitnessScript(stack, exec_script, flags, SigVersion::WITNESS_V0, checker, execdata, serror);
        } else if (program.size() == WITNESS_V0_KEYHASH_SIZE) {
            // BIP141 P2WPKH: 20-byte witness v0 program (which encodes Hash160(pubkey))
            if (stack.size() != 2) {
                return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH); // 2 items in witness
            }
            exec_script << OP_DUP << OP_HASH160 << program << OP_EQUALVERIFY << OP_CHECKSIG;
            return ExecuteWitnessScript(stack, exec_script, flags, SigVersion::WITNESS_V0, checker, execdata, serror);
        } else {
            return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_WRONG_LENGTH);
        }
    } else if (witversion == 1 && program.size() == WITNESS_V1_TAPROOT_SIZE && !is_p2sh) {
        // BIP341 Taproot: 32-byte non-P2SH witness v1 program (which encodes a P2C-tweaked pubkey)
        if (!(flags & SCRIPT_VERIFY_TAPROOT)) return set_success(serror);
        if (stack.size() == 0) return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_WITNESS_EMPTY);
        if (stack.size() >= 2 && !stack.back().empty() && stack.back()[0] == ANNEX_TAG) {
            // Drop annex (this is non-standard; see IsWitnessStandard)
            const valtype& annex = SpanPopBack(stack);
            execdata.m_annex_hash = (HashWriter{} << annex).GetSHA256();
            execdata.m_annex_present = true;
        } else {
            execdata.m_annex_present = false;
        }
        execdata.m_annex_init = true;
        if (stack.size() == 1) {
            // Key path spending (stack size is 1 after removing optional annex)
            if (!checker.CheckSchnorrSignature(stack.front(), program, SigVersion::TAPROOT, execdata, serror)) {
                return false; // serror is set
            }
            return set_success(serror);
        } else {
            // Script path spending (stack size is >1 after removing optional annex)
            const valtype& control = SpanPopBack(stack);
            const valtype& script = SpanPopBack(stack);
            if (control.size() < TAPROOT_CONTROL_BASE_SIZE || control.size() > TAPROOT_CONTROL_MAX_SIZE || ((control.size() - TAPROOT_CONTROL_BASE_SIZE) % TAPROOT_CONTROL_NODE_SIZE) != 0) {
                return set_error(serror, SCRIPT_ERR_TAPROOT_WRONG_CONTROL_SIZE);
            }
            execdata.m_tapleaf_hash = ComputeTapleafHash(control[0] & TAPROOT_LEAF_MASK, script);
            if (!VerifyTaprootCommitment(control, program, execdata.m_tapleaf_hash)) {
                return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH);
            }
            execdata.m_tapleaf_hash_init = true;
            if ((control[0] & TAPROOT_LEAF_MASK) == TAPROOT_LEAF_TAPSCRIPT) {
                // Tapscript (leaf version 0xc0)
                exec_script = CScript(script.begin(), script.end());
                execdata.m_validation_weight_left = ::GetSerializeSize(witness.stack) + VALIDATION_WEIGHT_OFFSET;
                execdata.m_validation_weight_left_init = true;
                return ExecuteWitnessScript(stack, exec_script, flags, SigVersion::TAPSCRIPT, checker, execdata, serror);
            }
            if (flags & SCRIPT_VERIFY_DISCOURAGE_UPGRADABLE_TAPROOT_VERSION) {
                return set_error(serror, SCRIPT_ERR_DISCOURAGE_UPGRADABLE_TAPROOT_VERSION);
            }
            return set_success(serror);
        }
    } else if (!is_p2sh && CScript::IsPayToAnchor(witversion, program)) {
        return true;
    } else {
        if (flags & SCRIPT_VERIFY_DISCOURAGE_UPGRADABLE_WITNESS_PROGRAM) {
            return set_error(serror, SCRIPT_ERR_DISCOURAGE_UPGRADABLE_WITNESS_PROGRAM);
        }
        // Other version/size/p2sh combinations return true for future softfork compatibility
        return true;
    }
    // There is intentionally no return statement here, to be able to use "control reaches end of non-void function" warnings to detect gaps in the logic above.
}